

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDFObjectHandle qpdf_oh_item_internal(qpdf_data qpdf,qpdf_oh item)

{
  size_t *psVar1;
  undefined8 uVar2;
  uint uVar3;
  _Node *p_Var4;
  char *cstr;
  Pipeline *this;
  undefined4 in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined4 in_register_00000034;
  qpdf_data qpdf_00;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle ret;
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  code *local_118;
  size_type sStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  int local_d4;
  _Any_data local_d0;
  code *local_c0;
  undefined8 uStack_b8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  qpdf_00 = (qpdf_data)CONCAT44(in_register_00000034,item);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1593:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1593:9)>
             ::_M_manager;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<QPDFObjectHandle_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1594:9)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<QPDFObjectHandle_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1594:9)>
             ::_M_manager;
  std::function<QPDFObjectHandle_()>::function
            ((function<QPDFObjectHandle_()> *)&local_68,(function<QPDFObjectHandle_()> *)&local_48);
  std::function<QPDFObjectHandle_(QPDFObjectHandle_&)>::function
            ((function<QPDFObjectHandle_(QPDFObjectHandle_&)> *)&local_d0,
             (function<QPDFObjectHandle_(QPDFObjectHandle_&)> *)&local_f8);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_a8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x18) = uStack_b8;
  if (local_c0 != (code *)0x0) {
    *(void **)local_a8._M_unused._0_8_ = local_d0._M_unused._M_object;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_d0._8_8_;
    *(code **)((long)local_a8._M_unused._0_8_ + 0x10) = local_c0;
    local_c0 = (code *)0x0;
    uStack_b8 = 0;
  }
  *(undefined4 *)((long)local_a8._M_unused._0_8_ + 0x20) = in_EDX;
  pcStack_90 = std::
               _Function_handler<QPDFObjectHandle_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<QPDFObjectHandle_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_148._0_8_ = (element_type *)0x0;
  local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148._24_8_ = (Pipeline *)local_148;
  std::function<QPDFObjectHandle_(_qpdf_data_*)>::function
            ((function<QPDFObjectHandle_(_qpdf_data_*)> *)local_128,
             (function<QPDFObjectHandle_(_qpdf_data_*)> *)&local_a8);
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_88._M_unused._0_8_ = local_148._24_8_;
  *(size_type *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(size_type *)((long)local_88._M_unused._0_8_ + 0x10) = 0;
  *(size_type *)((long)local_88._M_unused._0_8_ + 0x18) = 0;
  *(size_type *)((long)local_88._M_unused._0_8_ + 0x20) = sStack_110;
  if (local_118 != (code *)0x0) {
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_128._0_8_;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) = local_128._8_8_;
    *(code **)((long)local_88._M_unused._0_8_ + 0x18) = local_118;
    local_118 = (code *)0x0;
    sStack_110 = 0;
  }
  pcStack_70 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar3 = trap_errors(qpdf_00,(function<void_(_qpdf_data_*)> *)&local_88);
  _Var5._M_pi = extraout_RDX;
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (local_118 != (code *)0x0) {
    (*local_118)((_Any_data *)local_128,(_Any_data *)local_128,__destroy_functor);
    _Var5._M_pi = extraout_RDX_01;
  }
  uVar2 = local_148._8_8_;
  if (uVar3 < 2) {
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_148._0_8_;
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    local_148._0_8_ = (element_type *)0x0;
  }
  else {
    if (qpdf_00->silence_errors == false) {
      if (qpdf_00->oh_error_occurred == false) {
        local_108._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)(local_148 + 0x18),
                   (qpdf_00->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_d4 = 0;
        p_Var4 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf_00->warnings,
                            (qpdf_error_code_e *)&local_108._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_148 + 0x18),(char (*) [1])0x27ddae,&local_d4,
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(qpdf_00->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if ((Pipeline *)local_148._24_8_ != (Pipeline *)(local_128 + 8)) {
          operator_delete((void *)local_148._24_8_,(ulong)(local_128._8_8_ + 1));
        }
        qpdf_00->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError
                ((QPDFLogger *)(local_148 + 0x18),SUB41(local_108._M_allocated_capacity._0_4_,0));
      uVar2 = local_148._24_8_;
      cstr = (char *)(**(code **)(*(long *)(qpdf_00->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this = Pipeline::operator<<((Pipeline *)uVar2,cstr);
      Pipeline::operator<<(this,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
    }
    if (local_58 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_50)((_Any_data *)qpdf);
    _Var5._M_pi = extraout_RDX_02;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    _Var5._M_pi = extraout_RDX_03;
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
    _Var5._M_pi = extraout_RDX_04;
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    _Var5._M_pi = extraout_RDX_05;
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
    _Var5._M_pi = extraout_RDX_06;
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    _Var5._M_pi = extraout_RDX_07;
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    _Var5._M_pi = extraout_RDX_08;
  }
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)qpdf;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static QPDFObjectHandle
qpdf_oh_item_internal(qpdf_data qpdf, qpdf_oh item)
{
    return do_with_oh<QPDFObjectHandle>(
        qpdf,
        item,
        []() { return QPDFObjectHandle::newNull(); },
        [](QPDFObjectHandle& o) { return o; });
}